

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> *func,
          void *continuationFutureData,ContinuationType type)

{
  bool bVar1;
  ContinuationState CVar2;
  undefined1 in_CL;
  long in_RDX;
  function<void_(const_QFutureInterfaceBase_&)> *in_RSI;
  function<void_(const_QFutureInterfaceBase_&)> *in_RDI;
  long in_FS_OFFSET;
  QFutureInterfaceBasePrivate *futureData;
  QMutexLocker<QBasicMutex> lock;
  QFutureInterfaceBase *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff94;
  QMessageLogger local_38;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QMutexLocker<QBasicMutex>::QMutexLocker
            ((QMutexLocker<QBasicMutex> *)in_RSI,(QBasicMutex *)in_stack_ffffffffffffff78);
  bVar1 = isFinished((QFutureInterfaceBase *)0x6e0002);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff90);
  if (bVar1) {
    *(undefined1 *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xd8) = 1;
    QMutexLocker<QBasicMutex>::unlock((QMutexLocker<QBasicMutex> *)in_RSI);
    std::function<void_(const_QFutureInterfaceBase_&)>::operator()(in_RSI,in_stack_ffffffffffffff78)
    ;
    QMutexLocker<QBasicMutex>::relock((QMutexLocker<QBasicMutex> *)in_RSI);
  }
  CVar2 = std::atomic::operator_cast_to_ContinuationState
                    ((atomic<QFutureInterfaceBasePrivate::ContinuationState> *)0x6e007f);
  if (CVar2 != Cleaned) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(const_QFutureInterfaceBase_&)> *)0x6e00a0);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff94,uVar3),(char *)in_RDI,
                 (int)((ulong)in_RSI >> 0x20),(char *)in_stack_ffffffffffffff78);
      QMessageLogger::warning
                (&local_38,
                 "Adding a continuation to a future which already has a continuation. The existing continuation is overwritten."
                );
      if (*(long *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) != 0) {
        *(undefined8 *)
         (*(long *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) + 0xb0)
             = 0;
      }
    }
    std::function<void_(const_QFutureInterfaceBase_&)>::operator=(in_RDI,in_RSI);
    if (in_RDX != 0) {
      *(undefined1 *)(in_RDX + 0xd9) = in_CL;
      *(undefined8 *)(in_RDX + 0xb0) =
           *(undefined8 *)((long)&(in_RDI->super__Function_base)._M_functor + 8);
    }
    *(long *)(*(long *)((long)&(in_RDI->super__Function_base)._M_functor + 8) + 0xa8) = in_RDX;
  }
  QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void (const QFutureInterfaceBase &)> func,
                                           void *continuationFutureData, ContinuationType type)
{
    auto *futureData = static_cast<QFutureInterfaceBasePrivate *>(continuationFutureData);

    QMutexLocker lock(&d->continuationMutex);

    // If the state is ready, run continuation immediately,
    // otherwise save it for later.
    if (isFinished()) {
        d->continuationExecuted = true;
        lock.unlock();
        func(*this);
        lock.relock();
    }
    // Unless the continuation has been cleaned earlier, we have to
    // store the move-only continuation, to guarantee that the associated
    // future's data stays alive.
    if (d->continuationState != QFutureInterfaceBasePrivate::Cleaned) {
        if (d->continuation) {
            qWarning("Adding a continuation to a future which already has a continuation. "
                     "The existing continuation is overwritten.");
            if (d->continuationData)
                d->continuationData->nonConcludedParent = nullptr;
        }
        d->continuation = std::move(func);
        if (futureData) {
            futureData->continuationType = type;
            futureData->nonConcludedParent = d;
        }
        d->continuationData = futureData;
        Q_ASSERT_X(!futureData || futureData->continuationType != ContinuationType::Unknown,
                   "setContinuation", "Make sure to provide a correct continuation type!");
    }
}